

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall Assimp::ColladaParser::ReadEffectParam(ColladaParser *this,EffectParam *pParam)

{
  string *psVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar5;
  string local_50;
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar2 != '\0') {
    psVar1 = &pParam->mReference;
    do {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 == 1) {
        if (iVar3 != 1) {
LAB_00407ad5:
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"surface");
        if (iVar2 == 0) {
          TestOpening(this,"init_from");
          pcVar4 = GetTextContent(this);
          pParam->mType = Param_Surface;
          pcVar5 = (char *)(pParam->mReference)._M_string_length;
          strlen(pcVar4);
          std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar5,(ulong)pcVar4);
          TestClosing(this,"init_from");
          pcVar5 = "surface";
        }
        else {
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar2 != 1) goto LAB_00407ad5;
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar2 = strcmp((char *)CONCAT44(extraout_var_00,iVar2),"sampler2D");
          if ((iVar2 != 0) || (1 < this->mFormat - FV_1_4_n)) {
            iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar2 != 1) goto LAB_00407ad5;
            iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar2 = strcmp((char *)CONCAT44(extraout_var_01,iVar2),"sampler2D");
            if (iVar2 == 0) {
              TestOpening(this,"instance_image");
              GetAttribute(this,"url");
              iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])();
              if (*(char *)CONCAT44(extraout_var_02,iVar2) != '#') {
                local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_50,"Unsupported URL format in instance_image","");
                ThrowException(this,&local_50);
              }
              pcVar4 = (char *)CONCAT44(extraout_var_02,iVar2) + 1;
              pParam->mType = Param_Sampler;
              pcVar5 = (char *)(pParam->mReference)._M_string_length;
              strlen(pcVar4);
              std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar5,(ulong)pcVar4);
              SkipElement(this,"sampler2D");
            }
            else {
              SkipElement(this);
            }
            goto LAB_00407ab4;
          }
          TestOpening(this,"source");
          pcVar4 = GetTextContent(this);
          pParam->mType = Param_Sampler;
          pcVar5 = (char *)(pParam->mReference)._M_string_length;
          strlen(pcVar4);
          std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar5,(ulong)pcVar4);
          TestClosing(this,"source");
          pcVar5 = "sampler2D";
        }
        SkipElement(this,pcVar5);
      }
      else if (iVar3 == 2) {
        return;
      }
LAB_00407ab4:
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar2 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadEffectParam(Collada::EffectParam& pParam)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("surface"))
            {
                // image ID given inside <init_from> tags
                TestOpening("init_from");
                const char* content = GetTextContent();
                pParam.mType = Param_Surface;
                pParam.mReference = content;
                TestClosing("init_from");

                // don't care for remaining stuff
                SkipElement("surface");
            }
            else if (IsElement("sampler2D") && (FV_1_4_n == mFormat || FV_1_3_n == mFormat))
            {
                // surface ID is given inside <source> tags
                TestOpening("source");
                const char* content = GetTextContent();
                pParam.mType = Param_Sampler;
                pParam.mReference = content;
                TestClosing("source");

                // don't care for remaining stuff
                SkipElement("sampler2D");
            }
            else if (IsElement("sampler2D"))
            {
                // surface ID is given inside <instance_image> tags
                TestOpening("instance_image");
                int attrURL = GetAttribute("url");
                const char* url = mReader->getAttributeValue(attrURL);
                if (url[0] != '#')
                    ThrowException("Unsupported URL format in instance_image");
                url++;
                pParam.mType = Param_Sampler;
                pParam.mReference = url;
                SkipElement("sampler2D");
            }
            else
            {
                // ignore unknown element
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            break;
        }
    }
}